

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeMallocFreeReallocOverloadsDebug_Test::testBody
          (TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeMallocFreeReallocOverloadsDebug_Test
           *this)

{
  int *piVar1;
  MemoryLeakDetector *pMVar2;
  UtestShell *pUVar3;
  long lVar4;
  size_t sVar5;
  TestTerminator *pTVar6;
  char *pcVar7;
  char *pcVar8;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  SimpleString local_30;
  void *local_20;
  int *n;
  size_t storedAmountOfLeaks;
  TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeMallocFreeReallocOverloadsDebug_Test *this_local;
  
  storedAmountOfLeaks = (size_t)this;
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  n = (int *)MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  MemoryLeakWarningPlugin::turnOnThreadSafeNewDeleteOverloads();
  local_20 = cpputest_malloc(4);
  pUVar3 = UtestShell::getCurrent();
  lVar4 = (long)n + 1;
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar5 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,lVar4,sVar5,
             "LONGS_EQUAL(storedAmountOfLeaks + 1, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x1b0,pTVar6);
  if (mutexLockCount == 1) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b1,pTVar6);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_30);
    pcVar7 = SimpleString::asCharString(&local_30);
    StringFrom((int)local_50);
    pcVar8 = SimpleString::asCharString(local_50);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b1,pTVar6);
    SimpleString::~SimpleString(local_50);
    SimpleString::~SimpleString(&local_30);
  }
  if (mutexUnlockCount == 1) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b2,pTVar6);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_60);
    pcVar7 = SimpleString::asCharString(&local_60);
    StringFrom((int)&local_70);
    pcVar8 = SimpleString::asCharString(&local_70);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b2,pTVar6);
    SimpleString::~SimpleString(&local_70);
    SimpleString::~SimpleString(&local_60);
  }
  local_20 = cpputest_realloc(local_20,0xc);
  pUVar3 = UtestShell::getCurrent();
  lVar4 = (long)n + 1;
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar5 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,lVar4,sVar5,
             "LONGS_EQUAL(storedAmountOfLeaks + 1, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x1b6,pTVar6);
  if (mutexLockCount == 2) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b7,pTVar6);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_80);
    pcVar7 = SimpleString::asCharString(&local_80);
    StringFrom((int)&local_90);
    pcVar8 = SimpleString::asCharString(&local_90);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b7,pTVar6);
    SimpleString::~SimpleString(&local_90);
    SimpleString::~SimpleString(&local_80);
  }
  if (mutexUnlockCount == 2) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b8,pTVar6);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_a0);
    pcVar7 = SimpleString::asCharString(&local_a0);
    StringFrom((int)&local_b0);
    pcVar8 = SimpleString::asCharString(&local_b0);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b8,pTVar6);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_a0);
  }
  cpputest_free(local_20);
  pUVar3 = UtestShell::getCurrent();
  piVar1 = n;
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar5 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,piVar1,sVar5,
             "LONGS_EQUAL(storedAmountOfLeaks, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x1bc,pTVar6);
  if (mutexLockCount == 3) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1bd,pTVar6);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_c0);
    pcVar7 = SimpleString::asCharString(&local_c0);
    StringFrom((int)&local_d0);
    pcVar8 = SimpleString::asCharString(&local_d0);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1bd,pTVar6);
    SimpleString::~SimpleString(&local_d0);
    SimpleString::~SimpleString(&local_c0);
  }
  if (mutexUnlockCount == 3) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1be,pTVar6);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_e0);
    pcVar7 = SimpleString::asCharString(&local_e0);
    StringFrom((int)&local_f0);
    pcVar8 = SimpleString::asCharString(&local_f0);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1be,pTVar6);
    SimpleString::~SimpleString(&local_f0);
    SimpleString::~SimpleString(&local_e0);
  }
  MemoryLeakWarningPlugin::turnOnDefaultNotThreadSafeNewDeleteOverloads();
  return;
}

Assistant:

TEST(MemoryLeakWarningThreadSafe, turnOnThreadSafeMallocFreeReallocOverloadsDebug)
{
    size_t storedAmountOfLeaks = MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all);

    MemoryLeakWarningPlugin::turnOnThreadSafeNewDeleteOverloads();

    int *n = (int*) cpputest_malloc(sizeof(int));

    LONGS_EQUAL(storedAmountOfLeaks + 1, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(1, mutexLockCount);
    CHECK_EQUAL(1, mutexUnlockCount);

    n = (int*) cpputest_realloc(n, sizeof(int)*3);

    LONGS_EQUAL(storedAmountOfLeaks + 1, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(2, mutexLockCount);
    CHECK_EQUAL(2, mutexUnlockCount);

    cpputest_free(n);

    LONGS_EQUAL(storedAmountOfLeaks, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(3, mutexLockCount);
    CHECK_EQUAL(3, mutexUnlockCount);

    MemoryLeakWarningPlugin::turnOnDefaultNotThreadSafeNewDeleteOverloads();
}